

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::renderTexture3DView
               (TestContext *testContext,RenderContext *renderContext,TextureRenderer *renderer,
               ResultCollector *results,Random *rng,deUint32 name,ImageInfo *info,
               Texture3DView *refTexture,Verify verify)

{
  ostringstream *this;
  char *imageSetName;
  char *imageSetDesc;
  ChannelOrder x;
  ChannelType y;
  undefined4 uVar1;
  undefined4 textureTarget;
  undefined8 uVar2;
  pointer pCVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  int (*paiVar8) [2];
  undefined4 extraout_var_01;
  long lVar9;
  undefined4 extraout_var_02;
  TextureFormat *pTVar10;
  long lVar11;
  TextureFormat TVar12;
  byte bVar13;
  uint uVar14;
  allocator_type *__a;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  void *pvVar19;
  int target;
  IVec2 cellOrigin;
  RGBA threshold;
  Surface renderedFrame;
  IVec2 origin;
  vector<float,_std::allocator<float>_> texCoord;
  IVec4 boundingBox;
  TextureImageIterator imageIterator;
  IVec2 renderTargetSize;
  vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
  cellContents;
  RandomizedRenderGrid renderGrid;
  TextureFormat format;
  Vector<int,_2> res;
  TextureFormatInfo spec;
  uint local_414;
  int local_400 [4];
  Surface local_3f0;
  undefined1 local_3d8 [48];
  undefined1 local_3a8 [8];
  TextureFormat TStack_3a0;
  int local_398;
  int iStack_394;
  int iStack_390;
  int local_38c;
  void *local_388;
  long local_380;
  RenderContext *local_378;
  TextureFormat local_370;
  ChannelOrder local_368;
  ChannelType CStack_364;
  int local_360;
  int local_35c;
  undefined1 local_358 [40];
  int local_330;
  int local_32c;
  long local_328;
  deRandom *local_320;
  pointer local_318;
  TextureRenderer *local_310;
  ResultCollector *local_308;
  ulong local_300;
  TextureFormat local_2f8;
  size_type sStack_2f0;
  IVec2 local_2e8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
  local_2e0;
  RandomizedRenderGrid local_2c8;
  TextureFormat local_2a0;
  undefined1 local_298 [8];
  TextureFormat local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  void *local_278;
  ios_base local_220 [264];
  ImageInfo local_118;
  ReferenceParams local_104;
  TextureFormatInfo local_70;
  undefined4 extraout_var_00;
  
  local_370 = (TextureFormat)testContext->m_log;
  local_320 = &rng->m_rnd;
  local_310 = renderer;
  local_308 = results;
  iVar5 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar9 = CONCAT44(extraout_var,iVar5);
  local_2a0 = refTexture->m_levels->m_format;
  tcu::getTextureFormatInfo(&local_70,&local_2a0);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_104,TEXTURETYPE_3D);
  local_118.m_format = info->m_format;
  local_118.m_target = info->m_target;
  local_118.m_size.m_data._0_8_ = *(undefined8 *)(info->m_size).m_data;
  local_118.m_size.m_data[2] = (info->m_size).m_data[2];
  iVar5 = getLevelCount(info);
  TextureImageIterator::TextureImageIterator((TextureImageIterator *)local_358,&local_118,iVar5);
  local_104.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(local_2a0);
  local_104.sampler.wrapS = CLAMP_TO_EDGE;
  local_104.sampler.wrapT = CLAMP_TO_EDGE;
  local_104.sampler.wrapR = CLAMP_TO_EDGE;
  local_104.sampler.minFilter = NEAREST_MIPMAP_NEAREST;
  local_104.sampler.magFilter = NEAREST;
  local_104.sampler.lodThreshold = 0.0;
  local_104.sampler.normalizedCoords = true;
  local_104.sampler.compare = COMPAREMODE_NONE;
  local_104.sampler.compareChannel = 0;
  local_104.sampler.borderColor.v._0_8_ = 0;
  local_104.sampler.borderColor.v._8_8_ = 0;
  local_104.sampler.seamlessCubeMap = false;
  local_104.sampler._53_3_ = 0;
  local_104.sampler.depthStencilMode = MODE_DEPTH;
  local_104.super_RenderParams.colorScale.m_data[0] = local_70.lookupScale.m_data[0];
  local_104.super_RenderParams.colorScale.m_data[1] = local_70.lookupScale.m_data[1];
  local_104.super_RenderParams.colorScale.m_data[2] = local_70.lookupScale.m_data[2];
  local_104.super_RenderParams.colorScale.m_data[3] = local_70.lookupScale.m_data[3];
  local_104.super_RenderParams.colorBias.m_data[0] = local_70.lookupBias.m_data[0];
  local_104.super_RenderParams.colorBias.m_data[1] = local_70.lookupBias.m_data[1];
  local_104.super_RenderParams.colorBias.m_data[2] = local_70.lookupBias.m_data[2];
  local_104.super_RenderParams.colorBias.m_data[3] = local_70.lookupBias.m_data[3];
  (**(code **)(lVar9 + 8))(0x84c0);
  (**(code **)(lVar9 + 0xb8))(0x806f,name);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Failed to bind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x559);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2802,0x812f);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2803,0x812f);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x8072,0x812f);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2801,0x2700);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2800,0x2600);
  local_328 = lVar9;
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Failed to setup texture filtering state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x560);
  iVar5 = (*renderContext->_vptr_RenderContext[4])(renderContext);
  paiVar8 = (int (*) [2])CONCAT44(extraout_var_00,iVar5);
  bVar13 = 8 - (char)paiVar8[1][0];
  uVar18 = 0;
  if (0 < paiVar8[2][1]) {
    uVar18 = 0x1000000 << (8U - (char)paiVar8[2][1] & 0x1f);
  }
  uVar17 = 0x100 << (8U - (char)paiVar8[1][1] & 0x1f) | 1 << (bVar13 & 0x1f);
  uVar18 = 0x10000 << (8U - (char)paiVar8[2][0] & 0x1f) | uVar17 | uVar18;
  uVar16 = 1 << (bVar13 & 0x1f) & 0xff;
  if (0xfd < uVar16) {
    uVar16 = 0xfe;
  }
  uVar17 = uVar17 >> 8 & 0xff;
  if (0xfd < uVar17) {
    uVar17 = 0xfe;
  }
  uVar14 = uVar18 >> 0x10 & 0xff;
  if (0xfd < uVar14) {
    uVar14 = 0xfe;
  }
  uVar18 = uVar18 >> 0x18;
  if (0xfd < uVar18) {
    uVar18 = 0xfe;
  }
  local_400[3] = uVar14 * 0x10000 + (uVar17 << 8 | uVar16 | uVar18 << 0x18) + 0x1010101;
  local_378 = renderContext;
  iVar5 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar9 = CONCAT44(extraout_var_01,iVar5);
  local_2e8.m_data = *paiVar8;
  lVar11 = lVar9;
  if (((int)local_358._24_4_ < local_32c + -1) || (local_330 < local_358._0_4_ + -1)) {
    do {
      local_380 = lVar11;
      iVar5 = (local_32c - local_358._24_4_) * local_358._0_4_;
      local_298 = (undefined1  [8])local_358._28_8_;
      dVar6 = deRandom_getUint32(local_320);
      uVar15 = (ulong)dVar6;
      RandomizedRenderGrid::RandomizedRenderGrid
                (&local_2c8,&local_2e8,(IVec2 *)local_298,iVar5,dVar6);
      iVar5 = local_2c8.m_cellCount;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
      ::vector(&local_2e0,(long)local_2c8.m_cellCount,__a);
      local_414 = 0;
      if (local_2c8.m_currentCell < iVar5) {
        local_414 = 0;
        local_318 = local_2e0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = local_2c8.m_currentCell;
        do {
          local_2c8.m_currentCell = uVar18 + 1;
          local_300 = (ulong)(uint)local_2c8.m_currentCell;
          bVar4 = TextureImageIterator::nextImage((TextureImageIterator *)local_358);
          uVar2 = local_358._28_8_;
          textureTarget = local_358._24_4_;
          if (!bVar4) break;
          RandomizedRenderGrid::getOrigin(&local_2c8);
          uVar1 = local_358._8_4_;
          local_3a8._0_4_ = R;
          local_3a8._4_4_ = SNORM_INT8;
          TStack_3a0.order = R;
          TStack_3a0.type = SNORM_INT8;
          local_398 = 0;
          iStack_394 = 0;
          local_104.baseLevel = textureTarget;
          local_104.maxLevel = textureTarget;
          (**(code **)(lVar9 + 0x1360))(local_358._8_4_,0x813c,textureTarget);
          (**(code **)(lVar9 + 0x1360))(uVar1,0x813d,textureTarget);
          computeQuadTexCoords
                    ((vector<float,_std::allocator<float>_> *)local_3a8,
                     (TextureImageIterator *)local_358);
          (**(code **)(lVar9 + 0x1a00))
                    (local_3d8._0_8_ & 0xffffffff,local_3d8._4_4_,uVar2,(ulong)uVar2 >> 0x20);
          deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                    (local_310,0,(float *)local_3a8,&local_104.super_RenderParams);
          dVar6 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar6,"Failed to render.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                          ,0x499);
          pCVar3 = local_318;
          if (verify == VERIFY_COMPARE_REFERENCE) {
            lVar9 = (long)(int)local_414;
            *(undefined8 *)local_318[lVar9].origin.m_data = local_3d8._0_8_;
            local_400[2] = local_330;
            Functional::(anonymous_namespace)::getTextureImageName_abi_cxx11_
                      ((string *)local_298,(_anonymous_namespace_ *)(ulong)(uint)uVar1,textureTarget
                       ,local_330,(int)uVar15);
            std::__cxx11::string::operator=((string *)&pCVar3[lVar9].name,(string *)local_298);
            if (local_298 != (undefined1  [8])((long)local_298 + 0x10)) {
              operator_delete((void *)local_298,
                              CONCAT44(local_288._M_allocated_capacity._4_4_,
                                       local_288._M_allocated_capacity._0_4_) + 1);
            }
            Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
                      ((string *)local_298,(_anonymous_namespace_ *)(ulong)(uint)uVar1,textureTarget
                       ,local_400[2],(int)uVar15);
            std::__cxx11::string::operator=
                      ((string *)&pCVar3[lVar9].description,(string *)local_298);
            if (local_298 != (undefined1  [8])((long)local_298 + 0x10)) {
              operator_delete((void *)local_298,
                              CONCAT44(local_288._M_allocated_capacity._4_4_,
                                       local_288._M_allocated_capacity._0_4_) + 1);
            }
            tcu::Surface::setSize(&pCVar3[lVar9].reference,(ChannelOrder)uVar2,SUB84(uVar2,4));
            iVar7 = (*local_378->_vptr_RenderContext[4])();
            tcu::SurfaceAccess::SurfaceAccess
                      ((SurfaceAccess *)local_298,&pCVar3[lVar9].reference,
                       (PixelFormat *)(CONCAT44(extraout_var_02,iVar7) + 8));
            glu::TextureTestUtil::sampleTexture
                      ((SurfaceAccess *)local_298,refTexture,(float *)local_3a8,&local_104);
            local_414 = local_414 + 1;
            lVar9 = local_380;
          }
          if ((TextureFormat)local_3a8 != (TextureFormat)0x0) {
            operator_delete((void *)local_3a8,CONCAT44(iStack_394,local_398) - (long)local_3a8);
          }
          uVar18 = (uint)local_300;
        } while (uVar18 != iVar5);
      }
      if (0 < (int)local_414) {
        RandomizedRenderGrid::getUsedAreaBoundingBox(&local_2c8);
        tcu::Surface::Surface(&local_3f0,local_360,local_35c);
        y = CStack_364;
        x = local_368;
        local_3a8._0_4_ = RGBA;
        local_3a8._4_4_ = UNORM_INT8;
        pvVar19 = (void *)local_3f0.m_pixels.m_cap;
        if ((void *)local_3f0.m_pixels.m_cap != (void *)0x0) {
          pvVar19 = local_3f0.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_298,(TextureFormat *)local_3a8,local_3f0.m_width,
                   local_3f0.m_height,1,pvVar19);
        glu::readPixels(local_378,x,y,(PixelBufferAccess *)local_298);
        dVar6 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar6,"Failed to read pixels.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                        ,0x4b2);
        lVar9 = 0;
        uVar15 = 0;
        do {
          pCVar3 = local_2e0.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_298._4_4_ = CStack_364;
          local_298._0_4_ = local_368;
          local_400[0] = 0;
          local_400[1] = 0;
          lVar11 = 0;
          do {
            local_400[lVar11] =
                 *(int *)((long)((local_2e0.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->origin).m_data +
                         lVar11 * 4 + lVar9) - *(int *)(local_298 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          local_2f8.order = RGBA;
          local_2f8.type = UNORM_INT8;
          pvVar19 = (void *)local_3f0.m_pixels.m_cap;
          if ((void *)local_3f0.m_pixels.m_cap != (void *)0x0) {
            pvVar19 = local_3f0.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_3d8,&local_2f8,local_3f0.m_width,local_3f0.m_height,
                     1,pvVar19);
          tcu::getSubregion((PixelBufferAccess *)local_298,(PixelBufferAccess *)local_3d8,
                            local_400[0],local_400[1],pCVar3[uVar15].reference.m_width,
                            pCVar3[uVar15].reference.m_height);
          local_3a8 = local_298;
          local_398 = local_288._M_allocated_capacity._0_4_;
          TStack_3a0 = local_290;
          local_38c = local_288._12_4_;
          iStack_394 = local_288._M_allocated_capacity._4_4_;
          iStack_390 = local_288._8_4_;
          local_388 = local_278;
          imageSetName = pCVar3[uVar15].name._M_dataplus._M_p;
          imageSetDesc = pCVar3[uVar15].description._M_dataplus._M_p;
          local_3d8._0_4_ = RGBA;
          local_3d8._4_4_ = UNORM_INT8;
          pvVar19 = (void *)pCVar3[uVar15].reference.m_pixels.m_cap;
          if (pvVar19 != (void *)0x0) {
            pvVar19 = pCVar3[uVar15].reference.m_pixels.m_ptr;
          }
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_298,(TextureFormat *)local_3d8,
                     pCVar3[uVar15].reference.m_width,pCVar3[uVar15].reference.m_height,1,pvVar19);
          tcu::RGBA::toIVec((RGBA *)&local_2f8);
          local_3d8._0_4_ = local_2f8.order;
          local_3d8._4_4_ = local_2f8.type;
          local_3d8._8_8_ = sStack_2f0;
          bVar4 = tcu::intThresholdCompare
                            ((TestLog *)local_370,imageSetName,imageSetDesc,
                             (ConstPixelBufferAccess *)local_298,(ConstPixelBufferAccess *)local_3a8
                             ,(UVec4 *)local_3d8,COMPARE_LOG_ON_ERROR);
          if (bVar4) {
            local_298._0_4_ = local_370.order;
            local_298._4_4_ = local_370.type;
            this = (ostringstream *)(local_298 + 8);
            std::__cxx11::ostringstream::ostringstream(this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,"Image comparison of ",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,pCVar3[uVar15].description._M_dataplus._M_p,
                       pCVar3[uVar15].description._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," passed.",8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this);
            std::ios_base::~ios_base(local_220);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3d8,"Image comparison of ",&pCVar3[uVar15].description);
            pTVar10 = (TextureFormat *)std::__cxx11::string::append((char *)local_3d8);
            local_298 = (undefined1  [8])((long)local_298 + 0x10);
            TVar12 = (TextureFormat)(pTVar10 + 2);
            if (*pTVar10 == TVar12) {
              local_288._M_allocated_capacity._0_4_ = SUB84(*(qpTestLog **)TVar12,0);
              local_288._M_allocated_capacity._4_4_ =
                   (undefined4)((ulong)*(qpTestLog **)TVar12 >> 0x20);
              local_288._8_4_ = pTVar10[3].order;
              local_288._12_4_ = pTVar10[3].type;
            }
            else {
              local_288._M_allocated_capacity._0_4_ = SUB84(*(qpTestLog **)TVar12,0);
              local_288._M_allocated_capacity._4_4_ =
                   (undefined4)((ulong)*(qpTestLog **)TVar12 >> 0x20);
              local_298 = (undefined1  [8])*pTVar10;
            }
            local_290 = pTVar10[1];
            *pTVar10 = TVar12;
            pTVar10[1].order = R;
            pTVar10[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar10[2].order = R;
            tcu::ResultCollector::fail(local_308,(string *)local_298);
            if (local_298 != (undefined1  [8])((long)local_298 + 0x10)) {
              operator_delete((void *)local_298,
                              CONCAT44(local_288._M_allocated_capacity._4_4_,
                                       local_288._M_allocated_capacity._0_4_) + 1);
            }
            if (local_3d8._0_8_ != (long)local_3d8 + 0x10) {
              operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
            }
          }
          uVar15 = uVar15 + 1;
          lVar9 = lVar9 + 0x60;
        } while (uVar15 != local_414);
        tcu::Surface::~Surface(&local_3f0);
        lVar9 = local_380;
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::CellContents,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::CellContents>_>
      ::~vector(&local_2e0);
      lVar11 = local_380;
    } while (((int)local_358._24_4_ < local_32c + -1) || (local_330 < local_358._0_4_ + -1));
  }
  (**(code **)(lVar9 + 0x1360))(local_358._8_4_,0x813c,0);
  (**(code **)(lVar9 + 0x1360))(local_358._8_4_,0x813d,1000);
  lVar9 = local_328;
  (**(code **)(local_328 + 0xb8))(0x806f,0);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"Failed to unbind texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x565);
  return;
}

Assistant:

void renderTexture3DView (tcu::TestContext&			testContext,
						  glu::RenderContext&		renderContext,
						  TextureRenderer&			renderer,
						  tcu::ResultCollector&		results,
						  de::Random&				rng,
						  deUint32					name,
						  const ImageInfo&			info,
						  const tcu::Texture3DView&	refTexture,
						  Verify					verify)
{
	tcu::TestLog&					log				= testContext.getLog();
	const glw::Functions&			gl				= renderContext.getFunctions();
	const tcu::TextureFormat		format			= refTexture.getLevel(0).getFormat();
	const tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(format);

	ReferenceParams					renderParams	(TEXTURETYPE_3D);
	TextureImageIterator			imageIterator	(info, getLevelCount(info));

	renderParams.samplerType	= getSamplerType(format);
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST_MIPMAP_NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_3D, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind texture.");

	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup texture filtering state.");

	renderTexture<tcu::Texture3DView>(renderContext, renderer, renderParams, results, rng, refTexture, verify, imageIterator, log);

	gl.bindTexture(GL_TEXTURE_3D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unbind texture.");
}